

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseHead(TidyDocImpl *doc,Node *head,GetTokenMode mode)

{
  Lexer *pLVar1;
  Dict *pDVar2;
  Node *pNVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Bool BVar8;
  int iVar9;
  Node *node;
  Node *pNVar10;
  Node **ppNVar11;
  
  pLVar1 = doc->lexer;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node != (Node *)0x0) {
    iVar5 = 0;
    iVar4 = 0;
    do {
      pDVar2 = node->tag;
      if (pDVar2 == head->tag) {
        if (node->type == EndTag) {
          prvTidyFreeNode(doc,node);
          head->closed = yes;
          return;
        }
        if (pDVar2 != head->tag) goto LAB_00141e74;
LAB_00141e7e:
        if (node->type != StartTag) goto LAB_00141e85;
        goto LAB_00141efe;
      }
LAB_00141e74:
      if ((pDVar2 != (Dict *)0x0) && (pDVar2->id == TidyTag_HTML)) goto LAB_00141e7e;
LAB_00141e85:
      BVar8 = prvTidynodeIsText(node);
      if (BVar8 != no) {
        if ((*(int *)((doc->config).value + 0x3b) != 0) || (*(int *)((doc->config).value + 6) == 1))
        goto LAB_00142029;
LAB_00142014:
        prvTidyReport(doc,head,node,0x27e);
LAB_00142029:
        prvTidyUngetToken(doc);
        return;
      }
      if ((node->type == ProcInsTag) &&
         ((node->element != (ctmbstr)0x0 &&
          (iVar9 = prvTidytmbstrcmp(node->element,"xml-stylesheet"), iVar9 == 0)))) {
        prvTidyReport(doc,head,node,0x27e);
        pNVar10 = prvTidyFindHTML(doc);
        pNVar3 = pNVar10->parent;
        node->parent = pNVar3;
        node->next = pNVar10;
        node->prev = pNVar10->prev;
        pNVar10->prev = node;
        if (node->prev != (Node *)0x0) {
          node->prev->next = node;
        }
        if (pNVar3->content == pNVar10) {
          pNVar3->content = node;
        }
      }
      else {
        BVar8 = InsertMisc(head,node);
        if (BVar8 == no) {
          if (node->type == DocTypeTag) {
            InsertDocType(doc,head,node);
          }
          else {
            if (node->tag != (Dict *)0x0) {
              if ((node->tag->model & 4) == 0) {
                if (pLVar1->isvoyager == no) goto LAB_00142029;
                goto LAB_00142014;
              }
              BVar8 = prvTidynodeIsElement(node);
              if (BVar8 != no) {
                pDVar2 = node->tag;
                if (pDVar2 != (Dict *)0x0) {
                  if (pDVar2->id == TidyTag_TITLE) {
                    iVar6 = iVar5;
                    iVar7 = iVar4 + 1;
                    iVar9 = iVar4;
                  }
                  else {
                    if ((pDVar2 == (Dict *)0x0) || (pDVar2->id != TidyTag_BASE)) goto LAB_00141fd1;
                    iVar6 = iVar5 + 1;
                    iVar7 = iVar4;
                    iVar9 = iVar5;
                  }
                  iVar4 = iVar7;
                  iVar5 = iVar6;
                  if (0 < iVar9) {
                    prvTidyReport(doc,head,node,(head == (Node *)0x0) + 0x27f);
                  }
                }
LAB_00141fd1:
                node->parent = head;
                pNVar3 = head->last;
                node->prev = pNVar3;
                ppNVar11 = &pNVar3->next;
                if (pNVar3 == (Node *)0x0) {
                  ppNVar11 = &head->content;
                }
                *ppNVar11 = node;
                head->last = node;
                ParseTag(doc,node,IgnoreWhitespace);
                goto LAB_00141f1e;
              }
            }
LAB_00141efe:
            prvTidyReport(doc,head,node,0x235);
            prvTidyFreeNode(doc,node);
          }
        }
      }
LAB_00141f1e:
      node = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(ParseHead)(TidyDocImpl* doc, Node *head, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;
    int HasTitle = 0;
    int HasBase = 0;

    DEBUG_LOG(SPRTF("Enter ParseHead...\n"));
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == head->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            head->closed = yes;
            break;
        }

        /* find and discard multiple <head> elements */
        /* find and discard <html> in <head> elements */
        if ((node->tag == head->tag || nodeIsHTML(node)) && node->type == StartTag)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        if (TY_(nodeIsText)(node))
        {
            /*\ Issue #132 - avoid warning for missing body tag,
             *  if configured to --omit-otpional-tags yes
             *  Issue #314 - and if --show-body-only
            \*/
            if (!cfgBool( doc, TidyOmitOptionalTags ) &&
                !showingBodyOnly(doc) )
            {
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            }
            TY_(UngetToken)( doc );
            break;
        }

        if (node->type == ProcInsTag && node->element &&
            TY_(tmbstrcmp)(node->element, "xml-stylesheet") == 0)
        {
            TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            TY_(InsertNodeBeforeElement)(TY_(FindHTML)(doc), node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(head, node))
            continue;

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, head, node);
            continue;
        }

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /*
         if it doesn't belong in the head then
         treat as implicit end of head and deal
         with as part of the body
        */
        if (!(node->tag->model & CM_HEAD))
        {
            /* #545067 Implicit closing of head broken - warn only for XHTML input */
            if ( lexer->isvoyager )
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN );
            TY_(UngetToken)( doc );
            break;
        }

        if (TY_(nodeIsElement)(node))
        {
            if ( nodeIsTITLE(node) )
            {
                ++HasTitle;

                if (HasTitle > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }
            else if ( nodeIsBASE(node) )
            {
                ++HasBase;

                if (HasBase > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }

            TY_(InsertNodeAtEnd)(head, node);
            ParseTag(doc, node, IgnoreWhitespace);
            continue;
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG(SPRTF("Exit ParseHead 1...\n"));
}